

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddPropertyType
               (DynamicObject *object,IDiagObjectModelDisplay *objectDisplayRef,
               ScriptContext *scriptContext,bool forceSetValueProp)

{
  code *pcVar1;
  char16_t *pcVar2;
  IDiagObjectModelDisplay *pIVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  _E value_00;
  undefined4 *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RecyclableObject *pRVar8;
  JavascriptBoolean *this;
  JavascriptTypedNumber<long> *this_00;
  long lVar9;
  JavascriptTypedNumber<unsigned_long> *this_01;
  unsigned_long uVar10;
  JavascriptLibrary *pJVar11;
  JavascriptString *pJVar12;
  undefined4 extraout_var_01;
  size_t sVar13;
  _E src;
  double value_01;
  undefined1 auVar14 [16];
  byte local_209;
  JsrtDebugPropertyId local_114;
  JsrtDebugPropertyAttribute local_110;
  JsrtDebugPropertyAttribute local_10c;
  JsrtDebugPropertyAttribute local_108;
  JsrtDebugPropertyAttribute local_104;
  uint local_100;
  JsrtDebugPropertyAttribute propertyAttributes;
  DBGPROP_ATTRIB_FLAGS dbPropAttrib;
  JsrtDebugPropertyId local_f4 [3];
  JavascriptException *err;
  char16_t *local_d8;
  LPCWSTR value;
  char16_t *local_c8;
  char16 *className_1;
  char16_t *local_b8;
  char16 *className;
  JsrtDebugPropertyId local_a8;
  JsrtDebugPropertyId local_a4;
  JsrtDebugPropertyId local_a0;
  JsrtDebugPropertyId local_9c;
  JsrtDebugPropertyId local_98;
  JsrtDebugPropertyId local_94;
  JsrtDebugPropertyId local_90;
  JsrtDebugPropertyId local_8c;
  JsrtDebugPropertyId local_88;
  JsrtDebugPropertyId local_84;
  double local_80;
  double numberValue;
  JsrtDebugPropertyId local_70;
  JsrtDebugPropertyId local_6c;
  JsrtDebugPropertyId local_68;
  JsrtDebugPropertyId local_64;
  JsrtDebugPropertyId local_60;
  JsrtDebugPropertyId local_5c;
  JsrtDebugPropertyId local_58;
  TypeId local_54;
  long *plStack_50;
  TypeId typeId;
  IDiagObjectAddress *varAddress;
  Var varValue;
  bool addValue;
  bool addDisplay;
  ScriptContext *pSStack_38;
  bool forceSetValueProp_local;
  ScriptContext *scriptContext_local;
  IDiagObjectModelDisplay *objectDisplayRef_local;
  DynamicObject *object_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_1;
  
  varValue._7_1_ = forceSetValueProp;
  pSStack_38 = scriptContext;
  scriptContext_local = (ScriptContext *)objectDisplayRef;
  objectDisplayRef_local = (IDiagObjectModelDisplay *)object;
  if (objectDisplayRef == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x8e,"(objectDisplayRef != nullptr)","objectDisplayRef != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (pSStack_38 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x8f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  varValue._6_1_ = 0;
  varValue._5_1_ = 0;
  iVar5 = (*(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo[9])
                    (scriptContext_local,0);
  varAddress = (IDiagObjectAddress *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo[10])();
  plStack_50 = (long *)CONCAT44(extraout_var_00,iVar5);
  if (varAddress == (IDiagObjectAddress *)0x0) {
    iVar5 = (*(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo[3])();
    pIVar3 = objectDisplayRef_local;
    if (iVar5 == 0) {
      JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)&value,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetStringTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,value._0_4_,pJVar12,pSStack_38);
      varValue._5_1_ = 1;
    }
    else {
      JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)&className_1,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetObjectTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,className_1._0_4_,pJVar12,pSStack_38);
      varValue._6_1_ = 1;
      local_c8 = GetClassName(TypeIds_Object);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)((long)&value + 4),className);
      pcVar2 = local_c8;
      sVar13 = PAL_wcslen(local_c8);
      AddPropertyToObject((DynamicObject *)pIVar3,value._4_4_,pcVar2,sVar13,pSStack_38);
    }
  }
  else {
    object_local = (DynamicObject *)varAddress;
    if (varAddress == (IDiagObjectAddress *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar4 = Js::TaggedInt::Is(object_local);
    if (bVar4) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar4 = Js::JavascriptNumber::Is_NoTaggedIntCheck(object_local);
      if (bVar4) {
        local_18 = TypeIds_Number;
      }
      else {
        pRStack_10 = Js::UnsafeVarTo<Js::RecyclableObject>(object_local);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        local_14 = Js::RecyclableObject::GetTypeId(pRStack_10);
        if ((0x57 < (int)local_14) &&
           (BVar6 = Js::RecyclableObject::IsExternal(pRStack_10), BVar6 == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        local_18 = local_14;
      }
    }
    pIVar3 = objectDisplayRef_local;
    local_54 = local_18;
    switch(local_18) {
    case TypeIds_Undefined:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_58,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetUndefinedDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_58,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_5c,value);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pRVar8 = Js::JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
      AddPropertyToObject((DynamicObject *)pIVar3,local_5c,pRVar8,pSStack_38);
      varValue._6_1_ = 1;
      break;
    case TypeIds_Null:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_60,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetObjectTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_60,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_64,value);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pRVar8 = Js::JavascriptLibraryBase::GetNull(&pJVar11->super_JavascriptLibraryBase);
      AddPropertyToObject((DynamicObject *)pIVar3,local_64,pRVar8,pSStack_38);
      varValue._6_1_ = 1;
      break;
    case TypeIds_Boolean:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_68,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetBooleanTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_68,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_6c,value);
      this = Js::VarTo<Js::JavascriptBoolean>(varAddress);
      BVar6 = Js::JavascriptBoolean::GetValue(this);
      AddPropertyToObject((DynamicObject *)pIVar3,local_6c,(bool)(-(BVar6 == 1) & 1),pSStack_38);
      break;
    case TypeIds_FirstNumberType:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_70,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetNumberTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_70,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId
                ((JsrtDebugPropertyId *)((long)&numberValue + 4),value);
      value_01 = Js::TaggedInt::ToDouble(varAddress);
      AddPropertyToObject((DynamicObject *)pIVar3,numberValue._4_4_,value_01,pSStack_38);
      break;
    case TypeIds_Number:
      JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)&numberValue,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetNumberTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,numberValue._0_4_,pJVar12,pSStack_38);
      local_80 = Js::JavascriptNumber::GetValue(varAddress);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_84,value);
      AddPropertyToObject((DynamicObject *)pIVar3,local_84,local_80,pSStack_38);
      bVar4 = Js::NumberUtilities::IsFinite(local_80);
      if ((!bVar4) || (BVar6 = Js::JavascriptNumber::IsNegZero(local_80), BVar6 != 0)) {
        varValue._6_1_ = 1;
      }
      break;
    case TypeIds_Int64Number:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_88,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetNumberTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_88,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_8c,value);
      this_00 = Js::VarTo<Js::JavascriptTypedNumber<long>>(varAddress);
      lVar9 = Js::JavascriptTypedNumber<long>::GetValue(this_00);
      AddPropertyToObject((DynamicObject *)pIVar3,local_8c,(double)lVar9,pSStack_38);
      break;
    case TypeIds_LastNumberType:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_90,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetNumberTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_90,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_94,value);
      this_01 = Js::VarTo<Js::JavascriptTypedNumber<unsigned_long>>(varAddress);
      uVar10 = Js::JavascriptTypedNumber<unsigned_long>::GetValue(this_01);
      auVar14._8_4_ = (int)(uVar10 >> 0x20);
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = 0x45300000;
      AddPropertyToObject((DynamicObject *)pIVar3,local_94,
                          (auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0),pSStack_38
                         );
      break;
    case TypeIds_String:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_98,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetStringTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_98,pJVar12,pSStack_38);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_9c,value);
      pJVar12 = Js::VarTo<Js::JavascriptString>(varAddress);
      AddPropertyToObject((DynamicObject *)pIVar3,local_9c,pJVar12,pSStack_38);
      break;
    case TypeIds_Symbol:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_a0,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetSymbolTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_a0,pJVar12,pSStack_38);
      varValue._6_1_ = 1;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                         ,300,"(false)","Unhandled type");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      break;
    case TypeIds_Enumerator:
    case TypeIds_HostDispatch:
    case TypeIds_UnscopablesWrapperObject:
    case TypeIds_LastStaticType:
    case TypeIds_EngineInterfaceObject:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                         ,0xe5,"(false)","Not valid types");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      break;
    case TypeIds_Proxy:
    case TypeIds_Object:
    case TypeIds_Array:
    case TypeIds_NativeIntArray:
    case TypeIds_CopyOnAccessNativeIntArray:
    case TypeIds_ArrayLast:
    case TypeIds_ArrayLastWithES5:
    case TypeIds_Date:
    case TypeIds_RegEx:
    case TypeIds_Error:
    case TypeIds_BooleanObject:
    case TypeIds_NumberObject:
    case TypeIds_StringObject:
    case TypeIds_Arguments:
    case TypeIds_ArrayBuffer:
    case TypeIds_Int8Array:
    case TypeIds_Uint8Array:
    case TypeIds_Uint8ClampedArray:
    case TypeIds_Int16Array:
    case TypeIds_Uint16Array:
    case TypeIds_Int32Array:
    case TypeIds_Uint32Array:
    case TypeIds_Float32Array:
    case TypeIds_Float64Array:
    case TypeIds_Int64Array:
    case TypeIds_Uint64Array:
    case TypeIds_CharArray:
    case TypeIds_BoolArray:
    case TypeIds_DataView:
    case TypeIds_Map:
    case TypeIds_Set:
    case TypeIds_WeakMap:
    case TypeIds_WeakSet:
    case TypeIds_SymbolObject:
    case TypeIds_ArrayIterator:
    case TypeIds_MapIterator:
    case TypeIds_SetIterator:
    case TypeIds_StringIterator:
    case TypeIds_Generator:
    case TypeIds_AsyncGenerator:
    case TypeIds_AsyncFromSyncIterator:
    case TypeIds_Promise:
    case TypeIds_WebAssemblyModule:
    case TypeIds_WebAssemblyInstance:
    case TypeIds_WebAssemblyMemory:
    case TypeIds_LastBuiltinDynamicObject:
    case TypeIds_GlobalObject:
    case TypeIds_SpreadArgument:
      JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)((long)&className + 4),type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetObjectTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,className._4_4_,pJVar12,pSStack_38);
      varValue._6_1_ = 1;
      local_b8 = GetClassName(local_54);
      pIVar3 = objectDisplayRef_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId
                ((JsrtDebugPropertyId *)((long)&className_1 + 4),className);
      pcVar2 = local_b8;
      sVar13 = PAL_wcslen(local_b8);
      AddPropertyToObject((DynamicObject *)pIVar3,className_1._4_4_,pcVar2,sVar13,pSStack_38);
      break;
    case TypeIds_Function:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_a4,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetFunctionTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_a4,pJVar12,pSStack_38);
      varValue._6_1_ = 1;
      break;
    case TypeIds_LastTrueJavascriptObjectType:
    case TypeIds_HostObject:
    case TypeIds_ActivationObject:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                         ,0xeb,"(false)","Are these valid types for debugger?");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      break;
    case TypeIds_ModuleNamespace:
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_a8,type);
      pJVar11 = Js::ScriptContext::GetLibrary(pSStack_38);
      pJVar12 = Js::JavascriptLibrary::GetModuleTypeDisplayString(pJVar11);
      AddPropertyToObject((DynamicObject *)pIVar3,local_a8,pJVar12,pSStack_38);
      varValue._6_1_ = 1;
    }
  }
  if (((varValue._6_1_ & 1) != 0) || ((varValue._5_1_ & 1) != 0)) {
    local_d8 = (char16_t *)0x0;
    iVar5 = (*(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo[2])
                      (scriptContext_local,10);
    pIVar3 = objectDisplayRef_local;
    local_d8 = (char16_t *)CONCAT44(extraout_var_01,iVar5);
    src = value;
    if ((varValue._6_1_ & 1) != 0) {
      src = display;
    }
    JsrtDebugPropertyId::JsrtDebugPropertyId(local_f4,src);
    pcVar2 = local_d8;
    sVar13 = PAL_wcslen(local_d8);
    AddPropertyToObject((DynamicObject *)pIVar3,local_f4[0],pcVar2,sVar13,pSStack_38);
  }
  pIVar3 = objectDisplayRef_local;
  local_209 = 0;
  if (((varValue._7_1_ & 1) != 0) && (local_209 = 0, varAddress != (IDiagObjectAddress *)0x0)) {
    JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)&dbPropAttrib,value);
    bVar4 = HasProperty((DynamicObject *)pIVar3,(JsrtDebugPropertyId)dbPropAttrib,pSStack_38);
    local_209 = bVar4 ^ 0xff;
  }
  pIVar3 = objectDisplayRef_local;
  if ((local_209 & 1) != 0) {
    JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)&propertyAttributes,value);
    AddPropertyToObject((DynamicObject *)pIVar3,(JsrtDebugPropertyId)propertyAttributes._value,
                        varAddress,pSStack_38);
  }
  local_100 = (*(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo[5])();
  JsrtDebugPropertyAttribute::JsrtDebugPropertyAttribute(&local_104,NONE);
  if ((local_100 & 0x800) == 0x800) {
    JsrtDebugPropertyAttribute::JsrtDebugPropertyAttribute(&local_108,READ_ONLY_VALUE);
    JsrtDebugPropertyAttribute::operator|=(&local_104,local_108);
  }
  iVar5 = (*(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo[3])();
  if (iVar5 != 0) {
    JsrtDebugPropertyAttribute::JsrtDebugPropertyAttribute(&local_10c,HAVE_CHILDRENS);
    JsrtDebugPropertyAttribute::operator|=(&local_104,local_10c);
  }
  if ((plStack_50 != (long *)0x0) && (iVar5 = (**(code **)(*plStack_50 + 0x18))(), iVar5 != 0)) {
    JsrtDebugPropertyAttribute::JsrtDebugPropertyAttribute(&local_110,IN_TDZ);
    JsrtDebugPropertyAttribute::operator|=(&local_104,local_110);
  }
  pIVar3 = objectDisplayRef_local;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_114,propertyAttributes);
  value_00 = JsrtDebugPropertyAttribute::operator_cast_to__E(&local_104);
  AddPropertyToObject((DynamicObject *)pIVar3,local_114,value_00,pSStack_38);
  return;
}

Assistant:

void JsrtDebugUtils::AddPropertyType(Js::DynamicObject * object, Js::IDiagObjectModelDisplay* objectDisplayRef, Js::ScriptContext * scriptContext, bool forceSetValueProp)
{
    Assert(objectDisplayRef != nullptr);
    Assert(scriptContext != nullptr);

    bool addDisplay = false;
    bool addValue = false;

    Js::Var varValue = objectDisplayRef->GetVarValue(FALSE);
    Js::IDiagObjectAddress* varAddress = objectDisplayRef->GetDiagAddress();

    if (varValue != nullptr)
    {
        Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(varValue);

        switch (typeId)
        {
        case Js::TypeIds_Undefined:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetUndefinedDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, scriptContext->GetLibrary()->GetUndefined(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Null:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetObjectTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, scriptContext->GetLibrary()->GetNull(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Boolean:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetBooleanTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, Js::VarTo<Js::JavascriptBoolean>(varValue)->GetValue() == TRUE ? true : false, scriptContext);
            break;

        case Js::TypeIds_Integer:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, Js::TaggedInt::ToDouble(varValue), scriptContext);
            break;

        case Js::TypeIds_Number:
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);

            double numberValue = Js::JavascriptNumber::GetValue(varValue);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, numberValue, scriptContext);

            // If number is not finite (NaN, Infinity, -Infinity) or is -0 add display as well so that we can display special strings
            if (!Js::NumberUtilities::IsFinite(numberValue) || Js::JavascriptNumber::IsNegZero(numberValue))
            {
                addDisplay = true;
            }

            break;
        }
        case Js::TypeIds_Int64Number:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, (double)Js::VarTo<Js::JavascriptInt64Number>(varValue)->GetValue(), scriptContext);
            break;

        case Js::TypeIds_UInt64Number:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, (double)Js::VarTo<Js::JavascriptUInt64Number>(varValue)->GetValue(), scriptContext);
            break;

        case Js::TypeIds_String:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetStringTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, Js::VarTo<Js::JavascriptString>(varValue), scriptContext);
            break;

        case Js::TypeIds_Symbol:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetSymbolTypeDisplayString(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Function:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetFunctionTypeDisplayString(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_ModuleNamespace:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetModuleTypeDisplayString(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Enumerator:
        case Js::TypeIds_HostDispatch:
        case Js::TypeIds_UnscopablesWrapperObject:
        case Js::TypeIds_UndeclBlockVar:
        case Js::TypeIds_EngineInterfaceObject:
            AssertMsg(false, "Not valid types");
            break;

        case Js::TypeIds_ModuleRoot:
        case Js::TypeIds_HostObject:
        case Js::TypeIds_ActivationObject:
            AssertMsg(false, "Are these valid types for debugger?");
            break;

        case Js::TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
#endif
        case Js::TypeIds_NativeFloatArray:
        case Js::TypeIds_ES5Array:
        case Js::TypeIds_CharArray:
        case Js::TypeIds_BoolArray:
        case Js::TypeIds_ArrayIterator:
        case Js::TypeIds_MapIterator:
        case Js::TypeIds_SetIterator:
        case Js::TypeIds_StringIterator:
        case Js::TypeIds_Object:
        case Js::TypeIds_Array:
        case Js::TypeIds_Date:
        case Js::TypeIds_RegEx:
        case Js::TypeIds_Error:
        case Js::TypeIds_BooleanObject:
        case Js::TypeIds_NumberObject:
        case Js::TypeIds_StringObject:
        case Js::TypeIds_Arguments:
        case Js::TypeIds_ArrayBuffer:
        case Js::TypeIds_Int8Array:
        case Js::TypeIds_Uint8Array:
        case Js::TypeIds_Uint8ClampedArray:
        case Js::TypeIds_Int16Array:
        case Js::TypeIds_Uint16Array:
        case Js::TypeIds_Int32Array:
        case Js::TypeIds_Uint32Array:
        case Js::TypeIds_Float32Array:
        case Js::TypeIds_Float64Array:
        case Js::TypeIds_Int64Array:
        case Js::TypeIds_Uint64Array:
        case Js::TypeIds_DataView:
        case Js::TypeIds_Map:
        case Js::TypeIds_Set:
        case Js::TypeIds_WeakMap:
        case Js::TypeIds_WeakSet:
        case Js::TypeIds_SymbolObject:
        case Js::TypeIds_Generator:
        case Js::TypeIds_AsyncGenerator:
        case Js::TypeIds_AsyncFromSyncIterator:
        case Js::TypeIds_Promise:
        case Js::TypeIds_GlobalObject:
        case Js::TypeIds_SpreadArgument:
#ifdef ENABLE_WASM
        case Js::TypeIds_WebAssemblyModule:
        case Js::TypeIds_WebAssemblyInstance:
        case Js::TypeIds_WebAssemblyMemory:
        case Js::TypeIds_WebAssemblyTable:
#endif

        case Js::TypeIds_Proxy:
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetObjectTypeDisplayString(), scriptContext);
            addDisplay = true;
            const char16* className = JsrtDebugUtils::GetClassName(typeId);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::className, className, wcslen(className), scriptContext);
            break;
        }

        default:
            AssertMsg(false, "Unhandled type");
            break;
        }
    }
    else
    {
        if (objectDisplayRef->HasChildren())
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetObjectTypeDisplayString(), scriptContext);
            addDisplay = true;
            const char16* className = JsrtDebugUtils::GetClassName(Js::TypeIds_Object);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::className, className, wcslen(className), scriptContext);
        }
        else
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetStringTypeDisplayString(), scriptContext);
            addValue = true;
        }
    }

    if (addDisplay || addValue)
    {
        LPCWSTR value = nullptr;

        // Getting value might call getter which can throw so wrap in try catch
        try
        {
            value = objectDisplayRef->Value(10);
        }
        catch (const Js::JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            value = _u("");
        }

        JsrtDebugUtils::AddPropertyToObject(object, addDisplay ? JsrtDebugPropertyId::display : JsrtDebugPropertyId::value, value, wcslen(value), scriptContext);
    }

    if (forceSetValueProp && varValue != nullptr && !JsrtDebugUtils::HasProperty(object, JsrtDebugPropertyId::value, scriptContext))
    {
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, varValue, scriptContext);
    }

    DBGPROP_ATTRIB_FLAGS dbPropAttrib = objectDisplayRef->GetTypeAttribute();

    JsrtDebugPropertyAttribute propertyAttributes = JsrtDebugPropertyAttribute::NONE;

    if ((dbPropAttrib & DBGPROP_ATTRIB_VALUE_READONLY) == DBGPROP_ATTRIB_VALUE_READONLY)
    {
        propertyAttributes |= JsrtDebugPropertyAttribute::READ_ONLY_VALUE;
    }

    if (objectDisplayRef->HasChildren())
    {
        propertyAttributes |= JsrtDebugPropertyAttribute::HAVE_CHILDRENS;
    }

    if (varAddress != nullptr && varAddress->IsInDeadZone())
    {
        propertyAttributes |= JsrtDebugPropertyAttribute::IN_TDZ;
    }

    JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::propertyAttributes, (UINT)propertyAttributes, scriptContext);
}